

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

arima_object arima_init(int p,int d,int q,int N)

{
  arima_object paVar1;
  uint local_28;
  int local_24;
  int M;
  int i;
  arima_object obj;
  int N_local;
  int q_local;
  int d_local;
  int p_local;
  
  local_28 = (uint)(d < 1);
  if ((((-1 < p) && (-1 < d)) && (-1 < q)) && (0 < N)) {
    paVar1 = (arima_object)
             malloc((long)((p + q + N) - d) * 8 + 0x78 +
                    (long)(int)(p + q + local_28) * 8 * (long)(int)(p + q + local_28));
    paVar1->p = p;
    paVar1->d = d;
    paVar1->q = q;
    paVar1->N = N;
    paVar1->Nused = N - d;
    paVar1->M = local_28;
    paVar1->retval = 0;
    paVar1->cssml = 1;
    for (local_24 = 0; local_24 < p + q; local_24 = local_24 + 1) {
      *(undefined8 *)(&paVar1[1].N + (long)local_24 * 2) = 0;
    }
    paVar1->phi = (double *)(paVar1 + 1);
    paVar1->theta = (double *)(&paVar1[1].N + (long)p * 2);
    paVar1->res = (double *)(&paVar1[1].N + (long)(p + q) * 2);
    paVar1->vcov = (double *)(&paVar1[1].N + (long)((p + q + N) - d) * 2);
    paVar1->method = 0;
    paVar1->optmethod = 5;
    paVar1->mean = 0.0;
    paVar1->var = 1.0;
    paVar1->lvcov = (p + q + local_28) * (p + q + local_28);
    paVar1->ncoeff = p + q + local_28;
    return paVar1;
  }
  printf("\n Input Values cannot be Negative. Program Exiting. \n");
  exit(-1);
}

Assistant:

arima_object arima_init(int p, int d, int q, int N) {
	arima_object obj = NULL;
	int i,M;

	if (d > 0) {
		M = 0;
	}
	else {
		M = 1;
	}
	if (p < 0 || d < 0 || q < 0 || N <= 0) {
		printf("\n Input Values cannot be Negative. Program Exiting. \n");
		exit(-1);
	}
	//retval = 0 Input Error
	// retval = 1 Probable Success
	// retval = 4 Optimization Routine didn't converge
	// Retval = 15 Optimization Routine Encountered Inf/Nan Values
	
	obj = (arima_object)malloc(sizeof(struct arima_set) + sizeof(double) * (p+q+N-d) + sizeof(double) * (p+q+M)*(p+q+M));

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->N = N;
	obj->Nused = N - d;
	obj->M = M;
	obj->retval = 0;
	obj->cssml = 1;

	for (i = 0; i < p + q; ++i) {
		obj->params[i] = 0.0;
	}
	obj->phi = &obj->params[0];
	obj->theta = &obj->params[p];
	obj->res = &obj->params[p + q];
	obj->vcov = &obj->params[p + q + N - d];

	obj->method = 0;// 0 - MLE, 1 - CSS, 2 - Box-Jenkins
	obj->optmethod = 5; // Default Method is 5
	obj->mean = 0.0;
	obj->var = 1.0;
	obj->lvcov = (p + q + M)*(p + q + M);
	obj->ncoeff = p + q + M;

	return obj;
}